

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O2

QString * Driver::qtify(QString *__return_storage_ptr__,QString *name)

{
  long lVar1;
  bool bVar2;
  char16_t cVar3;
  QChar *pQVar4;
  char32_t ucs4;
  long lVar5;
  
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&name->d);
  cVar3 = *(__return_storage_ptr__->d).ptr;
  if ((cVar3 == L'Q') || (cVar3 == L'K')) {
    QString::remove((longlong)__return_storage_ptr__,0);
  }
  lVar1 = (__return_storage_ptr__->d).size;
  lVar5 = 0;
  while( true ) {
    if (lVar1 == lVar5) {
      return __return_storage_ptr__;
    }
    ucs4 = (char32_t)(ushort)(__return_storage_ptr__->d).ptr[lVar5];
    bVar2 = QChar::isUpper(ucs4);
    if (!bVar2) break;
    cVar3 = QChar::toLower(ucs4);
    pQVar4 = QString::data(__return_storage_ptr__);
    pQVar4[lVar5].ucs = cVar3;
    lVar5 = lVar5 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QString Driver::qtify(const QString &name)
{
    QString qname = name;

    if (qname.at(0) == u'Q' || qname.at(0) == u'K')
        qname.remove(0, 1);

    for (qsizetype i = 0, size = qname.size(); i < size && qname.at(i).isUpper(); ++i)
        qname[i] = qname.at(i).toLower();

    return qname;
}